

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_ecmult_multi_simple_var
              (secp256k1_gej *r,secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,
              void *cbdata,size_t n_points)

{
  undefined8 extraout_RAX;
  undefined8 uVar1;
  undefined8 extraout_RAX_00;
  long lVar2;
  secp256k1_fe *rzr;
  code *pcVar3;
  code *pcVar4;
  secp256k1_ge *psVar5;
  long lVar6;
  byte bVar7;
  secp256k1_scalar scalar;
  secp256k1_gej tmpj;
  secp256k1_ge point;
  secp256k1_gej pointj;
  
  bVar7 = 0;
  secp256k1_gej_set_infinity(r);
  secp256k1_gej_set_infinity(&tmpj);
  secp256k1_ecmult(r,&tmpj,&secp256k1_scalar_zero,inp_g_sc);
  uVar1 = extraout_RAX;
  pcVar3 = cb + 8;
  for (lVar6 = -8; lVar6 != 0; lVar6 = lVar6 + 4) {
    scalar = *(secp256k1_scalar *)(cb + 8 + lVar6);
    pcVar4 = pcVar3;
    psVar5 = &point;
    for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
      (psVar5->x).n[0] = *(uint64_t *)pcVar4;
      pcVar4 = pcVar4 + (ulong)bVar7 * -0x10 + 8;
      psVar5 = (secp256k1_ge *)((long)psVar5 + (ulong)bVar7 * -0x10 + 8);
    }
    secp256k1_gej_set_ge(&pointj,&point);
    rzr = (secp256k1_fe *)0x0;
    secp256k1_ecmult(&tmpj,&pointj,&scalar,(secp256k1_scalar *)0x0);
    secp256k1_gej_add_var(r,r,&tmpj,rzr);
    pcVar3 = pcVar3 + 0x68;
    uVar1 = extraout_RAX_00;
  }
  return (int)uVar1;
}

Assistant:

static int secp256k1_ecmult_multi_simple_var(secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points) {
    size_t point_idx;
    secp256k1_gej tmpj;

    secp256k1_gej_set_infinity(r);
    secp256k1_gej_set_infinity(&tmpj);
    /* r = inp_g_sc*G */
    secp256k1_ecmult(r, &tmpj, &secp256k1_scalar_zero, inp_g_sc);
    for (point_idx = 0; point_idx < n_points; point_idx++) {
        secp256k1_ge point;
        secp256k1_gej pointj;
        secp256k1_scalar scalar;
        if (!cb(&scalar, &point, point_idx, cbdata)) {
            return 0;
        }
        /* r += scalar*point */
        secp256k1_gej_set_ge(&pointj, &point);
        secp256k1_ecmult(&tmpj, &pointj, &scalar, NULL);
        secp256k1_gej_add_var(r, r, &tmpj, NULL);
    }
    return 1;
}